

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

object * __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
          (accessor<pybind11::detail::accessor_policies::str_attr> *this)

{
  object oStack_18;
  
  if ((this->cache).super_handle.m_ptr == (PyObject *)0x0) {
    getattr((pybind11 *)&oStack_18,(this->obj).m_ptr,this->key);
    object::operator=(&this->cache,&oStack_18);
    object::~object(&oStack_18);
  }
  return &this->cache;
}

Assistant:

object &get_cache() const {
        if (!cache) {
            cache = Policy::get(obj, key);
        }
        return cache;
    }